

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_collision_bench.cc
# Opt level: O2

int main(void)

{
  LogEntry *this;
  char *__s2;
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  time_t tVar4;
  char *pcVar5;
  uint64_t uVar6;
  size_t extraout_RDX;
  uint uVar7;
  int iVar8;
  StringPiece command;
  
  pvVar1 = operator_new__(160000000);
  pvVar2 = operator_new__(320000000);
  lVar3 = 8;
  do {
    *(undefined8 *)((long)pvVar2 + lVar3 + -8) = 0;
    *(undefined4 *)((long)pvVar2 + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x1312d008);
  iVar8 = 0;
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  for (lVar3 = 0; lVar3 != 160000000; lVar3 = lVar3 + 8) {
    RandomCommand((char **)((long)pvVar1 + lVar3));
    this = *(LogEntry **)((long)pvVar1 + lVar3);
    pcVar5 = (char *)strlen((char *)this);
    command.len_ = extraout_RDX;
    command.str_ = pcVar5;
    uVar6 = BuildLog::LogEntry::HashCommand(this,command);
    *(uint64_t *)((long)pvVar2 + lVar3 * 2) = uVar6;
    *(int *)((long)pvVar2 + lVar3 * 2 + 8) = iVar8;
    iVar8 = iVar8 + 1;
  }
  std::__sort<std::pair<unsigned_long,int>*,__gnu_cxx::__ops::_Iter_less_iter>
            (pvVar2,(long)pvVar2 + 320000000);
  uVar7 = 0;
  for (lVar3 = 0x18; lVar3 != 0x1312d008; lVar3 = lVar3 + 0x10) {
    if (*(long *)((long)pvVar2 + lVar3 + -0x18) == *(long *)((long)pvVar2 + lVar3 + -8)) {
      pcVar5 = *(char **)((long)pvVar1 + (long)*(int *)((long)pvVar2 + lVar3 + -0x10) * 8);
      __s2 = *(char **)((long)pvVar1 + (long)*(int *)((long)pvVar2 + lVar3) * 8);
      iVar8 = strcmp(pcVar5,__s2);
      if (iVar8 != 0) {
        printf("collision!\n  string 1: \'%s\'\n  string 2: \'%s\'\n",pcVar5,__s2);
        uVar7 = uVar7 + 1;
      }
    }
  }
  printf("\n\n%d collisions after %d runs\n",(ulong)uVar7,20000000);
  return 0;
}

Assistant:

int main() {
  const int N = 20 * 1000 * 1000;

  // Leak these, else 10% of the runtime is spent destroying strings.
  char** commands = new char*[N];
  pair<uint64_t, int>* hashes = new pair<uint64_t, int>[N];

  srand((int)time(NULL));

  for (int i = 0; i < N; ++i) {
    RandomCommand(&commands[i]);
    hashes[i] = make_pair(BuildLog::LogEntry::HashCommand(commands[i]), i);
  }

  sort(hashes, hashes + N);

  int collision_count = 0;
  for (int i = 1; i < N; ++i) {
    if (hashes[i - 1].first == hashes[i].first) {
      if (strcmp(commands[hashes[i - 1].second],
                 commands[hashes[i].second]) != 0) {
        printf("collision!\n  string 1: '%s'\n  string 2: '%s'\n",
               commands[hashes[i - 1].second],
               commands[hashes[i].second]);
        collision_count++;
      }
    }
  }
  printf("\n\n%d collisions after %d runs\n", collision_count, N);
}